

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tls13_client.cc
# Opt level: O3

ssl_hs_wait_t bssl::tls13_client_handshake(SSL_HANDSHAKE *hs)

{
  ushort uVar1;
  anon_union_4_2_c8db58f8_for_extensions aVar2;
  ECHConfig *pEVar3;
  _Head_base<0UL,_buf_mem_st_*,_false> __p_00;
  SSL_SESSION *pSVar4;
  size_t sVar5;
  ssl_session_st *psVar6;
  CERT *pCVar7;
  _func_int_SSL_ptr_void_ptr *p_Var8;
  SSL_CREDENTIAL *cred;
  ssl_session_st *psVar9;
  size_t __n;
  Prover *pPVar10;
  SSLKeyShare *pSVar11;
  undefined8 uVar12;
  undefined8 uVar13;
  undefined8 uVar14;
  Span<const_unsigned_char> traffic_secret;
  Span<const_unsigned_char> traffic_secret_00;
  Span<const_unsigned_char> traffic_secret_01;
  Span<const_unsigned_char> traffic_secret_02;
  Span<const_unsigned_char> in;
  undefined1 auVar15 [16];
  uint8_t *__p_01;
  undefined1 auVar16 [8];
  CBB *pCVar17;
  UniquePtr<struct_stack_st_CRYPTO_BUFFER> *pUVar18;
  bool bVar19;
  bool bVar20;
  bool bVar21;
  uint16_t uVar22;
  uint16_t uVar23;
  ssl_private_key_result_t sVar24;
  SSLSessionType SVar25;
  ssl_verify_result_t sVar26;
  int iVar27;
  SSL_CIPHER *cipher;
  SSL3_STATE *pSVar28;
  uchar *puVar29;
  ulong uVar30;
  OPENSSL_STACK *__p_02;
  EVP_MD *md;
  undefined4 extraout_var;
  CBS *contents;
  uint uVar31;
  long lVar32;
  undefined1 *puVar33;
  SSL *pSVar34;
  int iVar35;
  ulong in_R9;
  pointer __p;
  UniquePtr<SSL_SESSION> *this;
  ptrdiff_t _Num_3;
  long lVar36;
  ssl_hs_wait_t sVar37;
  ssl_hs_wait_t sVar38;
  ptrdiff_t _Num;
  Array<unsigned_char> *pAVar39;
  undefined1 auVar40 [16];
  undefined1 auVar41 [16];
  undefined1 auVar42 [16];
  undefined1 auVar43 [16];
  initializer_list<bssl::SSLExtension_*> extensions;
  Span<const_unsigned_char> psk;
  Span<const_unsigned_char> in_00;
  Span<const_unsigned_char> in_01;
  bool ech_accepted;
  uint8_t alert;
  CBS cookie_value;
  SSLExtension key_share;
  ParsedServerHello server_hello;
  SSLExtension ech_unused;
  SSLExtension supported_versions;
  SSLMessage msg;
  SSLExtension cookie;
  undefined7 in_stack_fffffffffffffe08;
  byte in_stack_fffffffffffffe0f;
  UniquePtr<SSL_SESSION> *in_stack_fffffffffffffe10;
  CBS local_1e8;
  undefined1 local_1d8 [8];
  undefined1 auStack_1d0 [48];
  undefined1 local_1a0 [8];
  CBS local_198;
  undefined1 local_188 [56];
  uint16_t local_150;
  uint8_t local_14e;
  bssl local_148 [24];
  SSLTranscript *local_130;
  undefined1 local_128 [8];
  CBS local_120;
  undefined1 local_110 [3];
  char cStack_10d;
  CBS local_108;
  SSLTranscript *local_f8;
  UniquePtr<SSL_CREDENTIAL> *local_f0;
  undefined1 local_e8 [8];
  undefined1 auStack_e0 [40];
  undefined1 local_b8 [3];
  char cStack_b5;
  undefined4 uStack_b4;
  undefined1 auStack_b0 [40];
  Array<unsigned_char> *local_88;
  UniquePtr<struct_stack_st_CRYPTO_BUFFER> *local_80;
  ulong local_78;
  SSL *local_70;
  SSL_SESSION *local_68;
  SSL_SESSION *local_60;
  uint8_t *local_58;
  EVP_MD_CTX *local_50;
  EVP_MD_CTX *local_48;
  SSL_SESSION *local_40;
  SSL_SESSION *local_38;
  
  this = &hs->new_session;
  local_38 = (SSL_SESSION *)&hs->client_traffic_secret_0;
  local_40 = (SSL_SESSION *)&hs->server_traffic_secret_0;
  local_f0 = &hs->credential;
  local_130 = &hs->transcript;
  local_80 = &hs->ca_names;
  local_f8 = &hs->inner_transcript;
  local_48 = &(hs->transcript).hash_.ctx_;
  local_50 = &(hs->inner_transcript).hash_.ctx_;
  local_58 = hs->inner_client_random;
  local_60 = (SSL_SESSION *)&hs->client_handshake_secret;
  local_68 = (SSL_SESSION *)&hs->server_handshake_secret;
  local_88 = &hs->cookie;
  do {
    uVar30 = (ulong)(uint)hs->tls13_state;
    sVar38 = ssl_hs_error;
    local_78 = uVar30;
    switch(uVar30) {
    case 0:
      pSVar34 = hs->ssl;
      if (pSVar34->s3->version == 0) {
        __assert_fail("ssl->s3->version != 0",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/ssl/tls13_client.cc"
                      ,0xb9,"enum ssl_hs_wait_t bssl::do_read_hello_retry_request(SSL_HANDSHAKE *)")
        ;
      }
      bVar21 = (*pSVar34->method->get_message)(pSVar34,(SSLMessage *)local_e8);
      sVar38 = ssl_hs_read_message;
      if (bVar21) {
        if ((hs->field_0x6c9 & 8) == 0) {
          bVar21 = (*pSVar34->method->add_change_cipher_spec)(pSVar34);
          sVar38 = ssl_hs_error;
          if (!bVar21) break;
        }
        local_188._16_2_ = 0;
        local_150 = 0;
        local_14e = '\0';
        local_1e8.data = (uint8_t *)CONCAT71(local_1e8.data._1_7_,0x32);
        bVar19 = parse_server_hello_tls13
                           (hs,(ParsedServerHello *)local_188,(uint8_t *)&local_1e8,
                            (SSLMessage *)local_e8);
        bVar21 = (bool)in_stack_fffffffffffffe0f;
        if (!bVar19) goto LAB_001640b8;
        cipher = SSL_get_cipher_by_value(local_150);
        if (cipher == (SSL_CIPHER *)0x0) {
LAB_001640cf:
          iVar27 = 0xf2;
          iVar35 = 0xd7;
LAB_001640eb:
          ERR_put_error(0x10,0,iVar27,
                        "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/ssl/tls13_client.cc"
                        ,iVar35);
          iVar27 = 0x2f;
        }
        else {
          uVar23 = SSL_CIPHER_get_min_version(cipher);
          uVar22 = ssl_protocol_version(pSVar34);
          if (uVar22 < uVar23) goto LAB_001640cf;
          uVar23 = SSL_CIPHER_get_max_version(cipher);
          uVar22 = ssl_protocol_version(pSVar34);
          if (uVar23 < uVar22) goto LAB_001640cf;
          uVar23 = SSL_CIPHER_get_protocol_id(cipher);
          bVar21 = ssl_tls13_cipher_meets_policy
                             (uVar23,((pSVar34->config)._M_t.
                                      super___uniq_ptr_impl<bssl::SSL_CONFIG,_bssl::internal::Deleter>
                                      ._M_t.
                                      super__Tuple_impl<0UL,_bssl::SSL_CONFIG_*,_bssl::internal::Deleter>
                                      .super__Head_base<0UL,_bssl::SSL_CONFIG_*,_false>._M_head_impl
                                     )->compliance_policy);
          if (!bVar21) goto LAB_001640cf;
          hs->new_cipher = cipher;
          bVar19 = false;
          if (local_188._32_8_ == 0x20) {
            auVar42[0] = -(*(uint8_t *)(local_188._24_8_ + 0x10) == 0xc2);
            auVar42[1] = -(*(uint8_t *)(local_188._24_8_ + 0x11) == 0xa2);
            auVar42[2] = -(*(uint8_t *)(local_188._24_8_ + 0x12) == '\x11');
            auVar42[3] = -(*(uint8_t *)(local_188._24_8_ + 0x13) == '\x16');
            auVar42[4] = -(*(uint8_t *)(local_188._24_8_ + 0x14) == 'z');
            auVar42[5] = -(*(uint8_t *)(local_188._24_8_ + 0x15) == 0xbb);
            auVar42[6] = -(*(uint8_t *)(local_188._24_8_ + 0x16) == 0x8c);
            auVar42[7] = -(*(uint8_t *)(local_188._24_8_ + 0x17) == '^');
            auVar42[8] = -(*(uint8_t *)(local_188._24_8_ + 0x18) == '\a');
            auVar42[9] = -(*(uint8_t *)(local_188._24_8_ + 0x19) == 0x9e);
            auVar42[10] = -(*(uint8_t *)(local_188._24_8_ + 0x1a) == '\t');
            auVar42[0xb] = -(*(uint8_t *)(local_188._24_8_ + 0x1b) == 0xe2);
            auVar42[0xc] = -(*(uint8_t *)(local_188._24_8_ + 0x1c) == 200);
            auVar42[0xd] = -(*(uint8_t *)(local_188._24_8_ + 0x1d) == 0xa8);
            auVar42[0xe] = -(*(uint8_t *)(local_188._24_8_ + 0x1e) == '3');
            auVar42[0xf] = -(*(uint8_t *)(local_188._24_8_ + 0x1f) == 0x9c);
            auVar40[0] = -(*(uint8_t *)local_188._24_8_ == 0xcf);
            auVar40[1] = -(*(uint8_t *)(local_188._24_8_ + 1) == '!');
            auVar40[2] = -(*(uint8_t *)(local_188._24_8_ + 2) == 0xad);
            auVar40[3] = -(*(uint8_t *)(local_188._24_8_ + 3) == 't');
            auVar40[4] = -(*(uint8_t *)(local_188._24_8_ + 4) == 0xe5);
            auVar40[5] = -(*(uint8_t *)(local_188._24_8_ + 5) == 0x9a);
            auVar40[6] = -(*(uint8_t *)(local_188._24_8_ + 6) == 'a');
            auVar40[7] = -(*(uint8_t *)(local_188._24_8_ + 7) == '\x11');
            auVar40[8] = -(*(uint8_t *)(local_188._24_8_ + 8) == 0xbe);
            auVar40[9] = -(*(uint8_t *)(local_188._24_8_ + 9) == '\x1d');
            auVar40[10] = -(*(uint8_t *)(local_188._24_8_ + 10) == 0x8c);
            auVar40[0xb] = -(*(uint8_t *)(local_188._24_8_ + 0xb) == '\x02');
            auVar40[0xc] = -(*(uint8_t *)(local_188._24_8_ + 0xc) == '\x1e');
            auVar40[0xd] = -(*(uint8_t *)(local_188._24_8_ + 0xd) == 'e');
            auVar40[0xe] = -(*(uint8_t *)(local_188._24_8_ + 0xe) == 0xb8);
            auVar40[0xf] = -(*(uint8_t *)(local_188._24_8_ + 0xf) == 0x91);
            auVar40 = auVar40 & auVar42;
            bVar19 = (ushort)((ushort)(SUB161(auVar40 >> 7,0) & 1) |
                              (ushort)(SUB161(auVar40 >> 0xf,0) & 1) << 1 |
                              (ushort)(SUB161(auVar40 >> 0x17,0) & 1) << 2 |
                              (ushort)(SUB161(auVar40 >> 0x1f,0) & 1) << 3 |
                              (ushort)(SUB161(auVar40 >> 0x27,0) & 1) << 4 |
                              (ushort)(SUB161(auVar40 >> 0x2f,0) & 1) << 5 |
                              (ushort)(SUB161(auVar40 >> 0x37,0) & 1) << 6 |
                              (ushort)(SUB161(auVar40 >> 0x3f,0) & 1) << 7 |
                              (ushort)(SUB161(auVar40 >> 0x47,0) & 1) << 8 |
                              (ushort)(SUB161(auVar40 >> 0x4f,0) & 1) << 9 |
                              (ushort)(SUB161(auVar40 >> 0x57,0) & 1) << 10 |
                              (ushort)(SUB161(auVar40 >> 0x5f,0) & 1) << 0xb |
                              (ushort)(SUB161(auVar40 >> 0x67,0) & 1) << 0xc |
                              (ushort)(SUB161(auVar40 >> 0x6f,0) & 1) << 0xd |
                              (ushort)(SUB161(auVar40 >> 0x77,0) & 1) << 0xe |
                             (ushort)(byte)(auVar40[0xf] >> 7) << 0xf) == 0xffff;
          }
          uVar23 = ssl_protocol_version(pSVar34);
          bVar21 = SSLTranscript::InitHash(local_130,uVar23,hs->new_cipher);
          sVar38 = ssl_hs_error;
          if ((!bVar21) ||
             ((bVar19 && (bVar21 = SSLTranscript::UpdateForHelloRetryRequest(local_130), !bVar21))))
          break;
          if ((hs->selected_ech_config)._M_t.
              super___uniq_ptr_impl<bssl::ECHConfig,_bssl::internal::Deleter>._M_t.
              super__Tuple_impl<0UL,_bssl::ECHConfig_*,_bssl::internal::Deleter>.
              super__Head_base<0UL,_bssl::ECHConfig_*,_false>._M_head_impl != (ECHConfig *)0x0) {
            uVar23 = ssl_protocol_version(pSVar34);
            bVar21 = SSLTranscript::InitHash(local_f8,uVar23,hs->new_cipher);
            sVar38 = ssl_hs_error;
            if ((!bVar21) ||
               ((bVar19 && (bVar21 = SSLTranscript::UpdateForHelloRetryRequest(local_f8), !bVar21)))
               ) break;
          }
          bVar20 = check_ech_confirmation
                             (hs,(bool *)&stack0xfffffffffffffe0f,(uint8_t *)&local_1e8,
                              (ParsedServerHello *)local_188);
          bVar21 = (bool)in_stack_fffffffffffffe0f;
          if (!bVar20) {
LAB_001640b8:
            in_stack_fffffffffffffe0f = (byte)local_1e8.data;
            goto LAB_001640bd;
          }
          pEVar3 = (hs->selected_ech_config)._M_t.
                   super___uniq_ptr_impl<bssl::ECHConfig,_bssl::internal::Deleter>._M_t.
                   super__Tuple_impl<0UL,_bssl::ECHConfig_*,_bssl::internal::Deleter>.
                   super__Head_base<0UL,_bssl::ECHConfig_*,_false>._M_head_impl;
          if (pEVar3 != (ECHConfig *)0x0) {
            pSVar34->s3->ech_status = ssl_ech_rejected - in_stack_fffffffffffffe0f;
          }
          if (!bVar19) {
            hs->tls13_state = 2;
            sVar38 = ssl_hs_ok;
            break;
          }
          _local_b8 = (CBB *)CONCAT44(uStack_b4,0x1002c);
          auStack_b0._0_8_ = (uint8_t *)0x0;
          auStack_b0._8_8_ = 0;
          local_1a0[2] = (hs->key_share_bytes).size_ != 0;
          local_1a0._0_2_ = 0x33;
          local_1a0[3] = 0;
          local_198.data = (uint8_t *)0x0;
          local_198.len = 0;
          _local_110 = 0x1002b;
          local_108.data = (uint8_t *)0x0;
          local_108.len = 0;
          local_128[2] = 1;
          if (pEVar3 == (ECHConfig *)0x0) {
            local_128[2] = hs->config->field_0x10d & 1;
          }
          local_128._0_2_ = 0xfe0d;
          local_128[3] = 0;
          local_120.data = (uint8_t *)0x0;
          local_120.len = 0;
          auStack_1d0._0_8_ = local_1a0;
          local_1d8 = (undefined1  [8])local_b8;
          auStack_1d0._8_8_ = local_110;
          auStack_1d0._16_8_ = local_128;
          bVar19 = ssl_parse_extensions
                             (local_148,&local_1e8,local_1d8,
                              (initializer_list<bssl::SSLExtension_*>)ZEXT816(4),SUB81(in_R9,0));
          bVar21 = (bool)in_stack_fffffffffffffe0f;
          if (!bVar19) goto LAB_001640b8;
          if (cStack_b5 == '\0') {
            if (local_1a0[3] != 0) {
LAB_00164a2d:
              if ((local_1a0[3] & 1) == 0) {
LAB_00164dfc:
                bVar21 = ssl_hash_message(hs,(SSLMessage *)local_e8);
                sVar38 = ssl_hs_error;
                if ((bVar21) &&
                   ((pSVar34->s3->ech_status != ssl_ech_accepted ||
                    (in.size_ = auStack_e0._24_8_, in.data_ = (uchar *)auStack_e0._16_8_,
                    bVar21 = SSLTranscript::Update(local_f8,in), bVar21)))) {
                  bVar21 = (*pSVar34->method->has_unprocessed_handshake_data)(pSVar34);
                  if (bVar21) {
                    ssl_send_alert(pSVar34,2,10);
                    sVar38 = ssl_hs_error;
                    ERR_put_error(0x10,0,0xff,
                                  "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/ssl/tls13_client.cc"
                                  ,0x150);
                  }
                  else {
                    (*pSVar34->method->next_message)(pSVar34);
                    puVar33 = &pSVar34->s3->field_0xdc;
                    *(ushort *)puVar33 = *(ushort *)puVar33 | 0x1000;
                    hs->tls13_state = 1;
                    sVar38 = ssl_hs_ok;
                    if ((hs->field_0x6c9 & 4) != 0) {
                      pSVar34->s3->early_data_reason = ssl_early_data_hello_retry_request;
                      bVar21 = close_early_data(hs,ssl_encryption_initial);
                      sVar38 = ssl_hs_error;
                      if (bVar21) {
                        sVar38 = ssl_hs_early_data_rejected;
                      }
                    }
                  }
                }
                break;
              }
              if ((hs->pake_prover)._M_t.
                  super___uniq_ptr_impl<bssl::spake2plus::Prover,_bssl::internal::Deleter>._M_t.
                  super__Tuple_impl<0UL,_bssl::spake2plus::Prover_*,_bssl::internal::Deleter>.
                  super__Head_base<0UL,_bssl::spake2plus::Prover_*,_false>._M_head_impl !=
                  (Prover *)0x0) {
                __assert_fail("!hs->pake_prover",
                              "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/ssl/tls13_client.cc"
                              ,0x122,
                              "enum ssl_hs_wait_t bssl::do_read_hello_retry_request(SSL_HANDSHAKE *)"
                             );
              }
              iVar27 = CBS_get_u16(&local_198,(uint16_t *)local_1d8);
              if ((iVar27 == 0) || (local_198.len != 0)) {
                ERR_put_error(0x10,0,0x89,
                              "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/ssl/tls13_client.cc"
                              ,0x127);
                uVar31 = 0x32;
                goto LAB_001640c5;
              }
              bVar21 = tls1_check_group_id(hs,local_1d8._0_2_);
              if (bVar21) {
                iVar27 = (*(hs->key_shares[0]._M_t.
                            super___uniq_ptr_impl<bssl::SSLKeyShare,_bssl::internal::Deleter>._M_t.
                            super__Tuple_impl<0UL,_bssl::SSLKeyShare_*,_bssl::internal::Deleter>.
                            super__Head_base<0UL,_bssl::SSLKeyShare_*,_false>._M_head_impl)->
                           _vptr_SSLKeyShare[2])();
                if ((uint16_t)iVar27 != local_1d8._0_2_) {
                  pSVar11 = hs->key_shares[1]._M_t.
                            super___uniq_ptr_impl<bssl::SSLKeyShare,_bssl::internal::Deleter>._M_t.
                            super__Tuple_impl<0UL,_bssl::SSLKeyShare_*,_bssl::internal::Deleter>.
                            super__Head_base<0UL,_bssl::SSLKeyShare_*,_false>._M_head_impl;
                  if (pSVar11 != (SSLKeyShare *)0x0) {
                    iVar27 = (*pSVar11->_vptr_SSLKeyShare[2])();
                    if ((uint16_t)iVar27 == local_1d8._0_2_) goto LAB_00164ab6;
                  }
                  bVar21 = ssl_setup_key_shares(hs,local_1d8._0_2_);
                  sVar38 = ssl_hs_error;
                  if (!bVar21) break;
                  goto LAB_00164dfc;
                }
LAB_00164ab6:
                ssl_send_alert(pSVar34,2,0x2f);
                iVar27 = 0x138;
              }
              else {
                ssl_send_alert(pSVar34,2,0x2f);
                iVar27 = 0x12f;
              }
              ERR_put_error(0x10,0,0xf3,
                            "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/ssl/tls13_client.cc"
                            ,iVar27);
              goto LAB_001640ca;
            }
            iVar27 = 0x11a;
            iVar35 = 0x10c;
            goto LAB_001640eb;
          }
          iVar27 = CBS_get_u16_length_prefixed((CBS *)auStack_b0,(CBS *)local_1d8);
          if (((iVar27 != 0) && (uVar12 = auStack_1d0._0_8_, auStack_1d0._0_8_ != 0)) &&
             ((uint8_t *)auStack_b0._8_8_ == (uint8_t *)0x0)) {
            auVar16 = local_1d8;
            bVar21 = Array<unsigned_char>::InitUninitialized(local_88,auStack_1d0._0_8_);
            if (bVar21) {
              memmove(local_88->data_,(void *)auVar16,uVar12);
              goto LAB_00164a2d;
            }
            goto LAB_001640ca;
          }
          ERR_put_error(0x10,0,0x89,
                        "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/ssl/tls13_client.cc"
                        ,0x115);
          iVar27 = 0x32;
        }
        ssl_send_alert(pSVar34,2,iVar27);
        sVar38 = ssl_hs_error;
      }
      break;
    case 1:
      if (hs->ssl->s3->ech_status == ssl_ech_accepted) {
        bVar21 = ssl_encrypt_client_hello
                           ((bssl *)hs,(SSL_HANDSHAKE *)0x0,
                            (Span<const_unsigned_char>)(ZEXT416((uint)hs->tls13_state) << 0x40));
        sVar38 = ssl_hs_error;
        if (!bVar21) break;
      }
      bVar21 = ssl_add_client_hello(hs);
      sVar38 = ssl_hs_error;
      if (bVar21) {
        ssl_done_writing_client_hello(hs);
        hs->tls13_state = 2;
LAB_00163b4a:
        sVar38 = ssl_hs_flush;
      }
      break;
    case 2:
      pSVar34 = hs->ssl;
      bVar21 = (*pSVar34->method->get_message)(pSVar34,(SSLMessage *)local_e8);
      sVar38 = ssl_hs_read_message;
      if (bVar21) {
        local_188._16_2_ = 0;
        local_150 = 0;
        local_14e = '\0';
        in_stack_fffffffffffffe0f = 0x32;
        bVar21 = parse_server_hello_tls13
                           (hs,(ParsedServerHello *)local_188,&stack0xfffffffffffffe0f,
                            (SSLMessage *)local_e8);
        if (bVar21) {
          if ((local_188._32_8_ == 0x20) &&
             (auVar43[0] = -(*(uint8_t *)(local_188._24_8_ + 0x10) == 0xc2),
             auVar43[1] = -(*(uint8_t *)(local_188._24_8_ + 0x11) == 0xa2),
             auVar43[2] = -(*(uint8_t *)(local_188._24_8_ + 0x12) == '\x11'),
             auVar43[3] = -(*(uint8_t *)(local_188._24_8_ + 0x13) == '\x16'),
             auVar43[4] = -(*(uint8_t *)(local_188._24_8_ + 0x14) == 'z'),
             auVar43[5] = -(*(uint8_t *)(local_188._24_8_ + 0x15) == 0xbb),
             auVar43[6] = -(*(uint8_t *)(local_188._24_8_ + 0x16) == 0x8c),
             auVar43[7] = -(*(uint8_t *)(local_188._24_8_ + 0x17) == '^'),
             auVar43[8] = -(*(uint8_t *)(local_188._24_8_ + 0x18) == '\a'),
             auVar43[9] = -(*(uint8_t *)(local_188._24_8_ + 0x19) == 0x9e),
             auVar43[10] = -(*(uint8_t *)(local_188._24_8_ + 0x1a) == '\t'),
             auVar43[0xb] = -(*(uint8_t *)(local_188._24_8_ + 0x1b) == 0xe2),
             auVar43[0xc] = -(*(uint8_t *)(local_188._24_8_ + 0x1c) == 200),
             auVar43[0xd] = -(*(uint8_t *)(local_188._24_8_ + 0x1d) == 0xa8),
             auVar43[0xe] = -(*(uint8_t *)(local_188._24_8_ + 0x1e) == '3'),
             auVar43[0xf] = -(*(uint8_t *)(local_188._24_8_ + 0x1f) == 0x9c),
             auVar41[0] = -(*(uint8_t *)local_188._24_8_ == 0xcf),
             auVar41[1] = -(*(uint8_t *)(local_188._24_8_ + 1) == '!'),
             auVar41[2] = -(*(uint8_t *)(local_188._24_8_ + 2) == 0xad),
             auVar41[3] = -(*(uint8_t *)(local_188._24_8_ + 3) == 't'),
             auVar41[4] = -(*(uint8_t *)(local_188._24_8_ + 4) == 0xe5),
             auVar41[5] = -(*(uint8_t *)(local_188._24_8_ + 5) == 0x9a),
             auVar41[6] = -(*(uint8_t *)(local_188._24_8_ + 6) == 'a'),
             auVar41[7] = -(*(uint8_t *)(local_188._24_8_ + 7) == '\x11'),
             auVar41[8] = -(*(uint8_t *)(local_188._24_8_ + 8) == 0xbe),
             auVar41[9] = -(*(uint8_t *)(local_188._24_8_ + 9) == '\x1d'),
             auVar41[10] = -(*(uint8_t *)(local_188._24_8_ + 10) == 0x8c),
             auVar41[0xb] = -(*(uint8_t *)(local_188._24_8_ + 0xb) == '\x02'),
             auVar41[0xc] = -(*(uint8_t *)(local_188._24_8_ + 0xc) == '\x1e'),
             auVar41[0xd] = -(*(uint8_t *)(local_188._24_8_ + 0xd) == 'e'),
             auVar41[0xe] = -(*(uint8_t *)(local_188._24_8_ + 0xe) == 0xb8),
             auVar41[0xf] = -(*(uint8_t *)(local_188._24_8_ + 0xf) == 0x91),
             auVar41 = auVar41 & auVar43,
             (ushort)((ushort)(SUB161(auVar41 >> 7,0) & 1) |
                      (ushort)(SUB161(auVar41 >> 0xf,0) & 1) << 1 |
                      (ushort)(SUB161(auVar41 >> 0x17,0) & 1) << 2 |
                      (ushort)(SUB161(auVar41 >> 0x1f,0) & 1) << 3 |
                      (ushort)(SUB161(auVar41 >> 0x27,0) & 1) << 4 |
                      (ushort)(SUB161(auVar41 >> 0x2f,0) & 1) << 5 |
                      (ushort)(SUB161(auVar41 >> 0x37,0) & 1) << 6 |
                      (ushort)(SUB161(auVar41 >> 0x3f,0) & 1) << 7 |
                      (ushort)(SUB161(auVar41 >> 0x47,0) & 1) << 8 |
                      (ushort)(SUB161(auVar41 >> 0x4f,0) & 1) << 9 |
                      (ushort)(SUB161(auVar41 >> 0x57,0) & 1) << 10 |
                      (ushort)(SUB161(auVar41 >> 0x5f,0) & 1) << 0xb |
                      (ushort)(SUB161(auVar41 >> 0x67,0) & 1) << 0xc |
                      (ushort)(SUB161(auVar41 >> 0x6f,0) & 1) << 0xd |
                      (ushort)(SUB161(auVar41 >> 0x77,0) & 1) << 0xe |
                     (ushort)(byte)(auVar41[0xf] >> 7) << 0xf) == 0xffff)) {
            ssl_send_alert(pSVar34,2,10);
            iVar27 = 0xdf;
            iVar35 = 0x183;
            goto LAB_00164493;
          }
          uVar23 = SSL_CIPHER_get_protocol_id(hs->new_cipher);
          if (uVar23 != local_150) {
            iVar27 = 0xf2;
            iVar35 = 0x189;
LAB_001644cb:
            ERR_put_error(0x10,0,iVar27,
                          "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/ssl/tls13_client.cc"
                          ,iVar35);
            iVar27 = 0x2f;
            goto LAB_001644dd;
          }
          pSVar28 = pSVar34->s3;
          if (pSVar28->ech_status == ssl_ech_accepted) {
            if ((pSVar28->field_0xdd & 0x10) == 0) {
LAB_0016389b:
              __p_00._M_head_impl =
                   (hs->inner_transcript).buffer_._M_t.
                   super___uniq_ptr_impl<buf_mem_st,_bssl::internal::Deleter>._M_t.
                   super__Tuple_impl<0UL,_buf_mem_st_*,_bssl::internal::Deleter>.
                   super__Head_base<0UL,_buf_mem_st_*,_false>._M_head_impl;
              (hs->inner_transcript).buffer_._M_t.
              super___uniq_ptr_impl<buf_mem_st,_bssl::internal::Deleter>._M_t.
              super__Tuple_impl<0UL,_buf_mem_st_*,_bssl::internal::Deleter>.
              super__Head_base<0UL,_buf_mem_st_*,_false>._M_head_impl = (buf_mem_st *)0x0;
              std::__uniq_ptr_impl<buf_mem_st,_bssl::internal::Deleter>::reset
                        ((__uniq_ptr_impl<buf_mem_st,_bssl::internal::Deleter> *)local_130,
                         __p_00._M_head_impl);
              EVP_MD_CTX_move(local_48,local_50);
              aVar2 = (anon_union_4_2_c8db58f8_for_extensions)hs->inner_extensions_sent;
              uVar23 = (hs->inner_transcript).version_;
              *(undefined2 *)&(hs->transcript).field_0x28 =
                   *(undefined2 *)&(hs->inner_transcript).field_0x28;
              (hs->transcript).version_ = uVar23;
              hs->extensions = aVar2;
              pSVar28 = pSVar34->s3;
              uVar12 = *(undefined8 *)local_58;
              uVar13 = *(undefined8 *)(local_58 + 8);
              uVar14 = *(undefined8 *)(local_58 + 0x18);
              *(undefined8 *)(pSVar28->client_random + 0x10) = *(undefined8 *)(local_58 + 0x10);
              *(undefined8 *)(pSVar28->client_random + 0x18) = uVar14;
              *(undefined8 *)pSVar28->client_random = uVar12;
              *(undefined8 *)(pSVar28->client_random + 8) = uVar13;
              pSVar28 = pSVar34->s3;
              goto LAB_0016390c;
            }
            bVar21 = check_ech_confirmation
                               (hs,(bool *)local_1d8,&stack0xfffffffffffffe0f,
                                (ParsedServerHello *)local_188);
            if (!bVar21) goto LAB_001648d5;
            if (local_1d8[0] != (bssl)0x0) goto LAB_0016389b;
            ERR_put_error(0x10,0,0x141,
                          "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/ssl/tls13_client.cc"
                          ,0x197);
            uVar31 = 0x2f;
            goto LAB_001648e2;
          }
LAB_0016390c:
          uVar12 = *(undefined8 *)local_188._24_8_;
          uVar13 = *(undefined8 *)(local_188._24_8_ + 8);
          uVar14 = *(undefined8 *)(local_188._24_8_ + 0x18);
          *(undefined8 *)(pSVar28->server_random + 0x10) = *(undefined8 *)(local_188._24_8_ + 0x10);
          *(undefined8 *)(pSVar28->server_random + 0x18) = uVar14;
          *(undefined8 *)pSVar28->server_random = uVar12;
          *(undefined8 *)(pSVar28->server_random + 8) = uVar13;
          pSVar4 = (pSVar34->session)._M_t.
                   super___uniq_ptr_impl<ssl_session_st,_bssl::internal::Deleter>._M_t.
                   super__Tuple_impl<0UL,_ssl_session_st_*,_bssl::internal::Deleter>.
                   super__Head_base<0UL,_ssl_session_st_*,_false>._M_head_impl;
          if ((pSVar4 == (SSL_SESSION *)0x0) ||
             (SVar25 = ssl_session_get_type(pSVar4), SVar25 != kPreSharedKey)) {
            bVar21 = false;
          }
          else {
            bVar21 = pSVar34->s3->ech_status != ssl_ech_rejected;
          }
          pCVar17 = _local_b8;
          uStack_b4 = SUB84(pCVar17,4);
          _local_b8 = CONCAT13(0,CONCAT12(hs->key_shares[0]._M_t.
                                          super___uniq_ptr_impl<bssl::SSLKeyShare,_bssl::internal::Deleter>
                                          ._M_t.
                                          super__Tuple_impl<0UL,_bssl::SSLKeyShare_*,_bssl::internal::Deleter>
                                          .super__Head_base<0UL,_bssl::SSLKeyShare_*,_false>.
                                          _M_head_impl != (SSLKeyShare *)0x0,0x33));
          auStack_b0._0_8_ = (uint8_t *)0x0;
          auStack_b0._8_8_ = 0;
          local_1a0[2] = (hs->pake_prover)._M_t.
                         super___uniq_ptr_impl<bssl::spake2plus::Prover,_bssl::internal::Deleter>.
                         _M_t.
                         super__Tuple_impl<0UL,_bssl::spake2plus::Prover_*,_bssl::internal::Deleter>
                         .super__Head_base<0UL,_bssl::spake2plus::Prover_*,_false>._M_head_impl !=
                         (Prover *)0x0;
          local_1a0._0_2_ = 0x8a3b;
          local_1a0[3] = 0;
          local_198.data = (uint8_t *)0x0;
          local_198.len = 0;
          _local_110 = CONCAT13(0,CONCAT12(bVar21,0x29));
          local_108.data = (uint8_t *)0x0;
          local_108.len = 0;
          local_128._0_4_ = 0x1002b;
          local_120.data = (uint8_t *)0x0;
          local_120.len = 0;
          auStack_1d0._0_8_ = local_110;
          local_1d8 = (undefined1  [8])local_b8;
          auStack_1d0._8_8_ = local_128;
          auStack_1d0._16_8_ = local_1a0;
          bVar21 = ssl_parse_extensions
                             (local_148,(CBS *)&stack0xfffffffffffffe0f,local_1d8,
                              (initializer_list<bssl::SSLExtension_*>)ZEXT816(4),SUB81(in_R9,0));
          if (!bVar21) goto LAB_001648d5;
          if ((((local_128[3] != '\x01') ||
               (iVar27 = CBS_get_u16(&local_120,(uint16_t *)&local_1e8), iVar27 == 0)) ||
              (local_120.len != 0)) || ((uint16_t)local_1e8.data != pSVar34->s3->version)) {
            iVar27 = 0x120;
            iVar35 = 0x1bf;
            goto LAB_001644cb;
          }
          if (local_1a0[3] == 1) {
            if ((cStack_b5 != '\0') || (cStack_10d == '\x01')) {
              ERR_put_error(0x10,0,0xde,
                            "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/ssl/tls13_client.cc"
                            ,0x1c9);
              iVar27 = 0x6e;
              goto LAB_001644dd;
            }
            pPVar10 = (hs->pake_prover)._M_t.
                      super___uniq_ptr_impl<bssl::spake2plus::Prover,_bssl::internal::Deleter>._M_t.
                      super__Tuple_impl<0UL,_bssl::spake2plus::Prover_*,_bssl::internal::Deleter>.
                      super__Head_base<0UL,_bssl::spake2plus::Prover_*,_false>._M_head_impl;
joined_r0x001647b2:
            if (pPVar10 != (Prover *)0x0) {
              in_stack_fffffffffffffe0f = 0x32;
              if (cStack_10d != '\0') {
                bVar21 = ssl_ext_pre_shared_key_parse_serverhello
                                   (hs,&stack0xfffffffffffffe0f,&local_108);
                if (!bVar21) goto LAB_001648d5;
                pSVar4 = (pSVar34->session)._M_t.
                         super___uniq_ptr_impl<ssl_session_st,_bssl::internal::Deleter>._M_t.
                         super__Tuple_impl<0UL,_ssl_session_st_*,_bssl::internal::Deleter>.
                         super__Head_base<0UL,_ssl_session_st_*,_false>._M_head_impl;
                if (pSVar4->ssl_version != pSVar34->s3->version) {
                  iVar27 = 0xbc;
                  iVar35 = 0x1ee;
                  goto LAB_001644cb;
                }
                if (pSVar4->cipher->algorithm_prf != hs->new_cipher->algorithm_prf) {
                  iVar27 = 0x10c;
                  iVar35 = 500;
                  goto LAB_001640eb;
                }
                bVar21 = ssl_session_is_context_valid(hs,pSVar4);
                if (bVar21) {
                  puVar33 = &pSVar34->s3->field_0xdc;
                  *(ushort *)puVar33 = *(ushort *)puVar33 | 0x20;
                  hs->field_0x6ca = hs->field_0x6ca | 0x80;
                  SSL_SESSION_dup((bssl *)local_1d8,
                                  (pSVar34->session)._M_t.
                                  super___uniq_ptr_impl<ssl_session_st,_bssl::internal::Deleter>.
                                  _M_t.
                                  super__Tuple_impl<0UL,_ssl_session_st_*,_bssl::internal::Deleter>.
                                  super__Head_base<0UL,_ssl_session_st_*,_false>._M_head_impl,0);
                  auVar16 = local_1d8;
                  auVar15._8_8_ = 0;
                  auVar15._0_8_ = auStack_1d0._0_8_;
                  _local_1d8 = (CBS)(auVar15 << 0x40);
                  std::__uniq_ptr_impl<ssl_session_st,_bssl::internal::Deleter>::reset
                            ((__uniq_ptr_impl<ssl_session_st,_bssl::internal::Deleter> *)this,
                             (pointer)auVar16);
                  std::unique_ptr<ssl_session_st,_bssl::internal::Deleter>::~unique_ptr
                            ((unique_ptr<ssl_session_st,_bssl::internal::Deleter> *)local_1d8);
                  if ((hs->new_session)._M_t.
                      super___uniq_ptr_impl<ssl_session_st,_bssl::internal::Deleter>._M_t.
                      super__Tuple_impl<0UL,_ssl_session_st_*,_bssl::internal::Deleter>.
                      super__Head_base<0UL,_ssl_session_st_*,_false>._M_head_impl !=
                      (ssl_session_st *)0x0) {
                    ssl_set_session(pSVar34,(SSL_SESSION *)0x0);
                    ssl_session_renew_timeout
                              (pSVar34,(this->_M_t).
                                       super___uniq_ptr_impl<ssl_session_st,_bssl::internal::Deleter>
                                       ._M_t.
                                       super__Tuple_impl<0UL,_ssl_session_st_*,_bssl::internal::Deleter>
                                       .super__Head_base<0UL,_ssl_session_st_*,_false>._M_head_impl,
                               ((pSVar34->session_ctx)._M_t.
                                super___uniq_ptr_impl<ssl_ctx_st,_bssl::internal::Deleter>._M_t.
                                super__Tuple_impl<0UL,_ssl_ctx_st_*,_bssl::internal::Deleter>.
                                super__Head_base<0UL,_ssl_ctx_st_*,_false>._M_head_impl)->
                               session_psk_dhe_timeout);
                    goto LAB_001649bd;
                  }
                  ssl_send_alert(pSVar34,2,0x50);
                }
                else {
                  ERR_put_error(0x10,0,0x65,
                                "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/ssl/tls13_client.cc"
                                ,0x1fc);
                  ssl_send_alert(pSVar34,2,0x2f);
                }
                sVar38 = ssl_hs_error;
                break;
              }
              bVar21 = ssl_get_new_session(hs);
              if (!bVar21) {
                uVar31 = 0x50;
                goto LAB_001648e2;
              }
LAB_001649bd:
              ((hs->new_session)._M_t.super___uniq_ptr_impl<ssl_session_st,_bssl::internal::Deleter>
               ._M_t.super__Tuple_impl<0UL,_ssl_session_st_*,_bssl::internal::Deleter>.
               super__Head_base<0UL,_ssl_session_st_*,_false>._M_head_impl)->cipher = hs->new_cipher
              ;
              uVar23 = ssl_protocol_version(pSVar34);
              md = (EVP_MD *)ssl_get_handshake_digest(uVar23,hs->new_cipher);
              iVar27 = EVP_MD_size(md);
              uVar30 = CONCAT44(extraout_var,iVar27);
              if ((pSVar34->s3->field_0xdc & 0x20) == 0) {
                puVar33 = kZeroes;
              }
              else {
                psVar6 = (this->_M_t).super___uniq_ptr_impl<ssl_session_st,_bssl::internal::Deleter>
                         ._M_t.super__Tuple_impl<0UL,_ssl_session_st_*,_bssl::internal::Deleter>.
                         super__Head_base<0UL,_ssl_session_st_*,_false>._M_head_impl;
                uVar30 = (ulong)(psVar6->secret).size_;
                puVar33 = (psVar6->secret).storage_;
              }
              psk.size_ = uVar30;
              psk.data_ = puVar33;
              bVar21 = tls13_init_key_schedule(hs,psk);
              sVar38 = ssl_hs_error;
              if (!bVar21) break;
              local_1d8 = (undefined1  [8])0x0;
              auStack_1d0._0_8_ = 0;
              in_stack_fffffffffffffe0f = 0x32;
              if (cStack_b5 == '\x01') {
                contents = (CBS *)auStack_b0;
                bVar21 = ssl_ext_key_share_parse_serverhello
                                   (hs,(Array<unsigned_char> *)local_1d8,&stack0xfffffffffffffe0f,
                                    contents);
LAB_00164be6:
                if (bVar21 == false) {
                  uVar31 = (uint)in_stack_fffffffffffffe0f;
                  goto LAB_00164d3c;
                }
                in_01.size_ = (size_t)contents;
                in_01.data_ = (uchar *)auStack_1d0._0_8_;
                bVar21 = tls13_advance_key_schedule((bssl *)hs,(SSL_HANDSHAKE *)local_1d8,in_01);
                sVar38 = ssl_hs_error;
                if (((bVar21) && (bVar21 = ssl_hash_message(hs,(SSLMessage *)local_e8), bVar21)) &&
                   (bVar21 = tls13_derive_handshake_secrets(hs), bVar21)) {
                  sVar38 = ssl_hs_error;
                  if (((hs->field_0x6c9 & 4) == 0) || (iVar27 = SSL_is_quic(pSVar34), iVar27 != 0))
                  {
                    in_R9 = (ulong)(hs->client_handshake_secret).size_;
                    traffic_secret_01.data_._7_1_ = (bool)in_stack_fffffffffffffe0f;
                    traffic_secret_01.data_._0_7_ = in_stack_fffffffffffffe08;
                    traffic_secret_01.size_ = (size_t)in_stack_fffffffffffffe10;
                    bVar21 = tls13_set_traffic_key
                                       ((bssl *)pSVar34,(SSL *)0x2,ssl_encryption_early_data,
                                        (evp_aead_direction_t)
                                        (hs->new_session)._M_t.
                                        super___uniq_ptr_impl<ssl_session_st,_bssl::internal::Deleter>
                                        ._M_t.
                                        super__Tuple_impl<0UL,_ssl_session_st_*,_bssl::internal::Deleter>
                                        .super__Head_base<0UL,_ssl_session_st_*,_false>._M_head_impl
                                        ,local_60,traffic_secret_01);
                    if (!bVar21) goto LAB_00164d50;
                  }
                  in_R9 = (ulong)(hs->server_handshake_secret).size_;
                  traffic_secret_02.data_._7_1_ = (bool)in_stack_fffffffffffffe0f;
                  traffic_secret_02.data_._0_7_ = in_stack_fffffffffffffe08;
                  traffic_secret_02.size_ = (size_t)in_stack_fffffffffffffe10;
                  bVar21 = tls13_set_traffic_key
                                     ((bssl *)pSVar34,(SSL *)0x2,ssl_encryption_initial,
                                      (evp_aead_direction_t)
                                      (hs->new_session)._M_t.
                                      super___uniq_ptr_impl<ssl_session_st,_bssl::internal::Deleter>
                                      ._M_t.
                                      super__Tuple_impl<0UL,_ssl_session_st_*,_bssl::internal::Deleter>
                                      .super__Head_base<0UL,_ssl_session_st_*,_false>._M_head_impl,
                                      local_68,traffic_secret_02);
                  if (bVar21) {
                    (*pSVar34->method->next_message)(pSVar34);
                    hs->tls13_state = 3;
                    sVar38 = ssl_hs_ok;
                  }
                }
              }
              else {
                if (local_1a0[3] == 1) {
                  contents = &local_198;
                  bVar21 = ssl_ext_pake_parse_serverhello
                                     (hs,(Array<unsigned_char> *)local_1d8,&stack0xfffffffffffffe0f,
                                      contents);
                  goto LAB_00164be6;
                }
                uVar31 = 0x50;
                ERR_put_error(0x10,0,0x44,
                              "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/ssl/tls13_client.cc"
                              ,0x22f);
LAB_00164d3c:
                sVar38 = ssl_hs_error;
                ssl_send_alert(pSVar34,2,uVar31);
              }
LAB_00164d50:
              Array<unsigned_char>::~Array((Array<unsigned_char> *)local_1d8);
              break;
            }
            iVar27 = 0x102;
            iVar35 = 0x1d6;
          }
          else {
            if ((hs->pake_prover)._M_t.
                super___uniq_ptr_impl<bssl::spake2plus::Prover,_bssl::internal::Deleter>._M_t.
                super__Tuple_impl<0UL,_bssl::spake2plus::Prover_*,_bssl::internal::Deleter>.
                super__Head_base<0UL,_bssl::spake2plus::Prover_*,_false>._M_head_impl ==
                (Prover *)0x0) {
              pPVar10 = (Prover *)((ulong)_local_b8 & 0x1000000);
              goto joined_r0x001647b2;
            }
            iVar27 = 0xa4;
            iVar35 = 0x1cf;
          }
          ERR_put_error(0x10,0,iVar27,
                        "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/ssl/tls13_client.cc"
                        ,iVar35);
          iVar27 = 0x6d;
LAB_001644dd:
          ssl_send_alert(pSVar34,2,iVar27);
          sVar38 = ssl_hs_error;
        }
        else {
LAB_001648d5:
          uVar31 = (uint)in_stack_fffffffffffffe0f;
LAB_001648e2:
          ssl_send_alert(pSVar34,2,uVar31);
LAB_001648e7:
          sVar38 = ssl_hs_error;
        }
      }
      break;
    case 3:
      pSVar34 = hs->ssl;
      bVar21 = (*pSVar34->method->get_message)(pSVar34,(SSLMessage *)local_188);
      sVar38 = ssl_hs_read_message;
      if (bVar21) {
        bVar21 = ssl_check_message_type(pSVar34,(SSLMessage *)local_188,8);
        sVar38 = ssl_hs_error;
        if (bVar21) {
          auStack_e0._0_8_ = CONCAT62(local_188._18_6_,local_188._16_2_);
          local_e8 = (undefined1  [8])local_188._8_8_;
          iVar27 = CBS_get_u16_length_prefixed((CBS *)local_e8,(CBS *)local_1d8);
          if ((iVar27 == 0) || ((uint8_t *)auStack_e0._0_8_ != (uint8_t *)0x0)) {
            ERR_put_error(0x10,0,0x89,
                          "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/ssl/tls13_client.cc"
                          ,0x25e);
            iVar27 = 0x32;
            goto LAB_001644dd;
          }
          bVar21 = ssl_parse_serverhello_tlsext(hs,(CBS *)local_1d8);
          if (!bVar21) {
            iVar27 = 0xbe;
            iVar35 = 0x264;
            goto LAB_00164493;
          }
          pSVar28 = pSVar34->s3;
          if ((*(uint *)&pSVar28->field_0xdc >> 9 & 1) == 0) {
LAB_001639f9:
            pAVar39 = &((this->_M_t).super___uniq_ptr_impl<ssl_session_st,_bssl::internal::Deleter>.
                        _M_t.super__Tuple_impl<0UL,_ssl_session_st_*,_bssl::internal::Deleter>.
                        super__Head_base<0UL,_ssl_session_st_*,_false>._M_head_impl)->early_alpn;
            in_stack_fffffffffffffe10 = (UniquePtr<SSL_SESSION> *)(pSVar28->alpn_selected).data_;
            sVar5 = (pSVar28->alpn_selected).size_;
            bVar21 = Array<unsigned_char>::InitUninitialized(pAVar39,sVar5);
            if (sVar5 != 0 && bVar21) {
              memmove(pAVar39->data_,in_stack_fffffffffffffe10,sVar5);
            }
            if (bVar21) {
              bVar21 = ssl_hash_message(hs,(SSLMessage *)local_188);
              sVar38 = ssl_hs_error;
              if (bVar21) {
                (*pSVar34->method->next_message)(pSVar34);
                hs->tls13_state = 4;
                sVar38 = ssl_hs_ok;
                if (((hs->field_0x6c9 & 4) != 0) && ((pSVar34->s3->field_0xdd & 2) == 0)) {
                  bVar21 = close_early_data(hs,ssl_encryption_handshake);
                  sVar38 = ssl_hs_error;
                  if (bVar21) {
                    sVar38 = ssl_hs_early_data_rejected;
                  }
                }
              }
              break;
            }
LAB_00164726:
            ssl_send_alert(pSVar34,2,0x50);
          }
          else {
            if ((*(uint *)&pSVar28->field_0xdc & 0x20) == 0) {
              __assert_fail("ssl->s3->session_reused",
                            "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/ssl/tls13_client.cc"
                            ,0x26a,
                            "enum ssl_hs_wait_t bssl::do_read_encrypted_extensions(SSL_HANDSHAKE *)"
                           );
            }
            if (pSVar28->ech_status == ssl_ech_rejected) {
              __assert_fail("ssl->s3->ech_status != ssl_ech_rejected",
                            "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/ssl/tls13_client.cc"
                            ,0x26e,
                            "enum ssl_hs_wait_t bssl::do_read_encrypted_extensions(SSL_HANDSHAKE *)"
                           );
            }
            psVar6 = (hs->new_session)._M_t.
                     super___uniq_ptr_impl<ssl_session_st,_bssl::internal::Deleter>._M_t.
                     super__Tuple_impl<0UL,_ssl_session_st_*,_bssl::internal::Deleter>.
                     super__Head_base<0UL,_ssl_session_st_*,_false>._M_head_impl;
            psVar9 = (hs->early_session)._M_t.
                     super___uniq_ptr_impl<ssl_session_st,_bssl::internal::Deleter>._M_t.
                     super__Tuple_impl<0UL,_ssl_session_st_*,_bssl::internal::Deleter>.
                     super__Head_base<0UL,_ssl_session_st_*,_false>._M_head_impl;
            if (psVar9->cipher == psVar6->cipher) {
              __n = (psVar9->early_alpn).size_;
              if ((__n == (pSVar28->alpn_selected).size_) &&
                 ((__n == 0 ||
                  (iVar27 = bcmp((psVar9->early_alpn).data_,(pSVar28->alpn_selected).data_,__n),
                  iVar27 == 0)))) {
                if (((hs->field_0x6cb & 1) == 0) && ((psVar6->field_0x1b8 & 0x40) == 0)) {
                  psVar6->field_0x1b8 = psVar9->field_0x1b8 & 0x40 | psVar6->field_0x1b8;
                  pAVar39 = &((hs->new_session)._M_t.
                              super___uniq_ptr_impl<ssl_session_st,_bssl::internal::Deleter>._M_t.
                              super__Tuple_impl<0UL,_ssl_session_st_*,_bssl::internal::Deleter>.
                              super__Head_base<0UL,_ssl_session_st_*,_false>._M_head_impl)->
                             local_application_settings;
                  psVar6 = (hs->early_session)._M_t.
                           super___uniq_ptr_impl<ssl_session_st,_bssl::internal::Deleter>._M_t.
                           super__Tuple_impl<0UL,_ssl_session_st_*,_bssl::internal::Deleter>.
                           super__Head_base<0UL,_ssl_session_st_*,_false>._M_head_impl;
                  in_stack_fffffffffffffe10 =
                       (UniquePtr<SSL_SESSION> *)(psVar6->local_application_settings).data_;
                  sVar5 = (psVar6->local_application_settings).size_;
                  bVar21 = Array<unsigned_char>::InitUninitialized(pAVar39,sVar5);
                  if (sVar5 != 0 && bVar21) {
                    memmove(pAVar39->data_,in_stack_fffffffffffffe10,sVar5);
                  }
                  if (bVar21) {
                    pAVar39 = &((hs->new_session)._M_t.
                                super___uniq_ptr_impl<ssl_session_st,_bssl::internal::Deleter>._M_t.
                                super__Tuple_impl<0UL,_ssl_session_st_*,_bssl::internal::Deleter>.
                                super__Head_base<0UL,_ssl_session_st_*,_false>._M_head_impl)->
                               peer_application_settings;
                    psVar6 = (hs->early_session)._M_t.
                             super___uniq_ptr_impl<ssl_session_st,_bssl::internal::Deleter>._M_t.
                             super__Tuple_impl<0UL,_ssl_session_st_*,_bssl::internal::Deleter>.
                             super__Head_base<0UL,_ssl_session_st_*,_false>._M_head_impl;
                    in_stack_fffffffffffffe10 =
                         (UniquePtr<SSL_SESSION> *)(psVar6->peer_application_settings).data_;
                    sVar5 = (psVar6->peer_application_settings).size_;
                    bVar21 = Array<unsigned_char>::InitUninitialized(pAVar39,sVar5);
                    if (sVar5 != 0 && bVar21) {
                      memmove(pAVar39->data_,in_stack_fffffffffffffe10,sVar5);
                    }
                    if (bVar21) {
                      pSVar28 = pSVar34->s3;
                      goto LAB_001639f9;
                    }
                  }
                  goto LAB_00164726;
                }
                iVar27 = 0x117;
                iVar35 = 0x27e;
              }
              else {
                iVar27 = 0x115;
                iVar35 = 0x276;
              }
            }
            else {
              iVar27 = 0x130;
              iVar35 = 0x271;
            }
            ERR_put_error(0x10,0,iVar27,
                          "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/ssl/tls13_client.cc"
                          ,iVar35);
            ssl_send_alert(pSVar34,2,0x2f);
          }
          sVar38 = ssl_hs_error;
        }
      }
      break;
    case 4:
      pSVar34 = hs->ssl;
      uVar1 = *(ushort *)&pSVar34->s3->field_0xdc;
      if ((uVar1 & 0x20) == 0) {
        if ((hs->pake_prover)._M_t.
            super___uniq_ptr_impl<bssl::spake2plus::Prover,_bssl::internal::Deleter>._M_t.
            super__Tuple_impl<0UL,_bssl::spake2plus::Prover_*,_bssl::internal::Deleter>.
            super__Head_base<0UL,_bssl::spake2plus::Prover_*,_false>._M_head_impl == (Prover *)0x0)
        {
          bVar21 = (*pSVar34->method->get_message)(pSVar34,(SSLMessage *)local_188);
          auVar41 = auStack_b0._0_16_;
          sVar38 = ssl_hs_read_message;
          if (!bVar21) break;
          if (local_188[1] != '\r') {
LAB_001649a8:
            hs->tls13_state = 5;
            goto LAB_00163f24;
          }
          local_e8._0_4_ = 0x1000d;
          auStack_e0._0_8_ = (uint8_t *)0x0;
          auStack_e0._8_8_ = (uint8_t *)0x0;
          local_1d8._0_4_ = 0x1002f;
          auStack_1d0._0_8_ = 0;
          auStack_1d0._8_8_ = (uint8_t *)0x0;
          auStack_b0._2_6_ = local_188._18_6_;
          auStack_b0._0_2_ = local_188._16_2_;
          _local_b8 = (CBB *)local_188._8_8_;
          auStack_b0._8_8_ = auVar41._8_8_;
          in_stack_fffffffffffffe0f = 0x32;
          iVar27 = CBS_get_u8_length_prefixed((CBS *)local_b8,(CBS *)local_1a0);
          if ((((iVar27 != 0) && (local_198.data == (uint8_t *)0x0)) &&
              (iVar27 = CBS_get_u16_length_prefixed((CBS *)local_b8,(CBS *)local_110), iVar27 != 0))
             && ((uint8_t *)auStack_b0._0_8_ == (uint8_t *)0x0)) {
            local_1e8.data = local_e8;
            local_1e8.len = (size_t)local_1d8;
            extensions._M_len = 1;
            extensions._M_array = (iterator)0x2;
            bVar21 = ssl_parse_extensions
                               ((bssl *)local_110,(CBS *)&stack0xfffffffffffffe0f,
                                (uint8_t *)&local_1e8,extensions,SUB81(in_R9,0));
            if (((bVar21) && (local_e8[3] == '\x01')) &&
               ((iVar27 = CBS_get_u16_length_prefixed((CBS *)auStack_e0,(CBS *)local_128),
                iVar27 != 0 && (bVar21 = tls1_parse_peer_sigalgs(hs,(CBS *)local_128), bVar21)))) {
              if (local_1d8[3] == '\x01') {
                SSL_parse_CA_list((bssl *)&local_1e8,pSVar34,&stack0xfffffffffffffe0f,
                                  (CBS *)(local_1d8 + 8));
                pUVar18 = local_80;
                __p_01 = local_1e8.data;
                local_1e8.data = (uint8_t *)0x0;
                std::__uniq_ptr_impl<stack_st_CRYPTO_BUFFER,_bssl::internal::Deleter>::reset
                          ((__uniq_ptr_impl<stack_st_CRYPTO_BUFFER,_bssl::internal::Deleter> *)
                           local_80,(pointer)__p_01);
                std::unique_ptr<stack_st_CRYPTO_BUFFER,_bssl::internal::Deleter>::~unique_ptr
                          ((unique_ptr<stack_st_CRYPTO_BUFFER,_bssl::internal::Deleter> *)&local_1e8
                          );
                bVar21 = (bool)in_stack_fffffffffffffe0f;
                if ((pUVar18->_M_t).
                    super___uniq_ptr_impl<stack_st_CRYPTO_BUFFER,_bssl::internal::Deleter>._M_t.
                    super__Tuple_impl<0UL,_stack_st_CRYPTO_BUFFER_*,_bssl::internal::Deleter>.
                    super__Head_base<0UL,_stack_st_CRYPTO_BUFFER_*,_false>._M_head_impl !=
                    (stack_st_CRYPTO_BUFFER *)0x0) goto LAB_0016496d;
LAB_001640bd:
                uVar31 = (uint)in_stack_fffffffffffffe0f;
                in_stack_fffffffffffffe0f = bVar21;
              }
              else {
                __p_02 = OPENSSL_sk_new_null();
                pUVar18 = local_80;
                std::__uniq_ptr_impl<stack_st_CRYPTO_BUFFER,_bssl::internal::Deleter>::reset
                          ((__uniq_ptr_impl<stack_st_CRYPTO_BUFFER,_bssl::internal::Deleter> *)
                           local_80,(pointer)__p_02);
                if ((pUVar18->_M_t).
                    super___uniq_ptr_impl<stack_st_CRYPTO_BUFFER,_bssl::internal::Deleter>._M_t.
                    super__Tuple_impl<0UL,_stack_st_CRYPTO_BUFFER_*,_bssl::internal::Deleter>.
                    super__Head_base<0UL,_stack_st_CRYPTO_BUFFER_*,_false>._M_head_impl !=
                    (stack_st_CRYPTO_BUFFER *)0x0) {
LAB_0016496d:
                  hs->field_0x6c8 = hs->field_0x6c8 | 0x20;
                  (*((pSVar34->ctx)._M_t.super___uniq_ptr_impl<ssl_ctx_st,_bssl::internal::Deleter>.
                     _M_t.super__Tuple_impl<0UL,_ssl_ctx_st_*,_bssl::internal::Deleter>.
                     super__Head_base<0UL,_ssl_ctx_st_*,_false>._M_head_impl)->x509_method->
                    hs_flush_cached_ca_names)(hs);
                  bVar21 = ssl_hash_message(hs,(SSLMessage *)local_188);
                  sVar38 = ssl_hs_error;
                  if (!bVar21) break;
                  (*pSVar34->method->next_message)(pSVar34);
                  goto LAB_001649a8;
                }
                uVar31 = 0x50;
              }
LAB_001640c5:
              ssl_send_alert(pSVar34,2,uVar31);
LAB_001640ca:
              sVar38 = ssl_hs_error;
              break;
            }
          }
          ssl_send_alert(pSVar34,2,(uint)in_stack_fffffffffffffe0f);
          iVar27 = 0x89;
          iVar35 = 0x2ce;
LAB_00164493:
          ERR_put_error(0x10,0,iVar27,
                        "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/ssl/tls13_client.cc"
                        ,iVar35);
          sVar38 = ssl_hs_error;
          break;
        }
      }
      else if (((uVar1 >> 9 & 1) == 0) &&
              (((pSVar34->ctx)._M_t.super___uniq_ptr_impl<ssl_ctx_st,_bssl::internal::Deleter>._M_t.
                super__Tuple_impl<0UL,_ssl_ctx_st_*,_bssl::internal::Deleter>.
                super__Head_base<0UL,_ssl_ctx_st_*,_false>._M_head_impl)->reverify_on_resume !=
               false)) {
        hs->tls13_state = 7;
        goto LAB_00163f24;
      }
      hs->tls13_state = 8;
      goto LAB_00163f24;
    case 5:
      pSVar34 = hs->ssl;
      bVar21 = (*pSVar34->method->get_message)(pSVar34,(SSLMessage *)local_188);
      sVar38 = ssl_hs_read_message;
      if (bVar21) {
        if (local_188[1] != '\x19') {
          bVar21 = ssl_check_message_type(pSVar34,(SSLMessage *)local_188,0xb);
          sVar38 = ssl_hs_error;
          if (!bVar21) break;
        }
        bVar21 = tls13_process_certificate(hs,(SSLMessage *)local_188,false);
        sVar38 = ssl_hs_error;
        if ((bVar21) && (bVar21 = ssl_hash_message(hs,(SSLMessage *)local_188), bVar21)) {
          (*pSVar34->method->next_message)(pSVar34);
          hs->tls13_state = 6;
          goto LAB_00163f24;
        }
      }
      break;
    case 6:
      pSVar34 = hs->ssl;
      bVar21 = (*pSVar34->method->get_message)(pSVar34,(SSLMessage *)local_188);
      sVar38 = ssl_hs_read_message;
      if (bVar21) {
        sVar26 = ssl_verify_peer_cert(hs);
        sVar38 = ssl_hs_error;
        if (sVar26 != ssl_verify_invalid) {
          if (sVar26 == ssl_verify_retry) {
            sVar38 = ssl_hs_certificate_verify;
            iVar27 = 6;
            goto LAB_00164162;
          }
          bVar21 = ssl_check_message_type(pSVar34,(SSLMessage *)local_188,0xf);
          if (((bVar21) &&
              (bVar21 = tls13_process_certificate_verify(hs,(SSLMessage *)local_188), bVar21)) &&
             (bVar21 = ssl_hash_message(hs,(SSLMessage *)local_188), bVar21)) {
            (*pSVar34->method->next_message)(pSVar34);
            goto LAB_00164157;
          }
        }
      }
      break;
    case 7:
      sVar26 = ssl_reverify_peer_cert(hs,true);
      sVar38 = ssl_hs_error;
      if (sVar26 != ssl_verify_invalid) {
        if (sVar26 == ssl_verify_retry) {
          sVar38 = ssl_hs_certificate_verify;
          iVar27 = 7;
        }
        else {
LAB_00164157:
          sVar38 = ssl_hs_ok;
          iVar27 = 8;
        }
LAB_00164162:
        hs->tls13_state = iVar27;
      }
      break;
    case 8:
      pSVar34 = hs->ssl;
      bVar21 = (*pSVar34->method->get_message)(pSVar34,(SSLMessage *)local_188);
      sVar38 = ssl_hs_read_message;
      if (bVar21) {
        bVar21 = ssl_check_message_type(pSVar34,(SSLMessage *)local_188,0x14);
        sVar38 = ssl_hs_error;
        if (bVar21) {
          sVar37 = ssl_hs_error;
          bVar21 = tls13_process_finished(hs,(SSLMessage *)local_188,false);
          sVar38 = ssl_hs_error;
          if ((bVar21) &&
             (bVar21 = ssl_hash_message(hs,(SSLMessage *)local_188), sVar38 = sVar37, bVar21)) {
            puVar29 = (uchar *)SSLTranscript::DigestLen(local_130);
            in_00.size_ = uVar30;
            in_00.data_ = puVar29;
            bVar21 = tls13_advance_key_schedule((bssl *)hs,(SSL_HANDSHAKE *)kZeroes,in_00);
            if ((bVar21) && (bVar21 = tls13_derive_application_secrets(hs), bVar21)) {
              bVar21 = (*pSVar34->method->has_unprocessed_handshake_data)(pSVar34);
              if (bVar21) {
                ssl_send_alert(pSVar34,2,10);
                iVar27 = 0xff;
                iVar35 = 0x33e;
                goto LAB_00164493;
              }
              (*pSVar34->method->next_message)(pSVar34);
              hs->tls13_state = 9;
              goto LAB_00163f24;
            }
          }
        }
      }
      break;
    case 9:
      pSVar34 = hs->ssl;
      if ((pSVar34->s3->field_0xdd & 2) != 0) {
        iVar27 = SSL_is_quic(pSVar34);
        if ((iVar27 == 0) && (iVar27 = SSL_is_dtls(pSVar34), iVar27 == 0)) {
          CBB_zero((CBB *)local_188);
          bVar21 = (*pSVar34->method->init_message)(pSVar34,(CBB *)local_188,(CBB *)local_e8,'\x05')
          ;
          if ((!bVar21) || (bVar21 = ssl_add_message_cbb(pSVar34,(CBB *)local_188), !bVar21)) {
            CBB_cleanup((CBB *)local_188);
            goto LAB_001648e7;
          }
          CBB_cleanup((CBB *)local_188);
        }
        bVar21 = close_early_data(hs,ssl_encryption_handshake);
        sVar38 = ssl_hs_error;
        if (!bVar21) break;
      }
      hs->tls13_state = 10;
      goto LAB_00163f24;
    case 10:
      if (((((hs->new_session)._M_t.super___uniq_ptr_impl<ssl_session_st,_bssl::internal::Deleter>.
             _M_t.super__Tuple_impl<0UL,_ssl_session_st_*,_bssl::internal::Deleter>.
             super__Head_base<0UL,_ssl_session_st_*,_false>._M_head_impl)->field_0x1b8 & 0x40) != 0)
         && (pSVar34 = hs->ssl, (pSVar34->s3->field_0xdd & 2) == 0)) {
        CBB_zero((CBB *)local_188);
        uVar23 = 0x44cd;
        if ((*(ushort *)&hs->config->field_0x10d >> 0xd & 1) == 0) {
          uVar23 = 0x4469;
        }
        bVar21 = (*pSVar34->method->init_message)(pSVar34,(CBB *)local_188,(CBB *)local_e8,'\b');
        if (((((!bVar21) ||
              (iVar27 = CBB_add_u16_length_prefixed((CBB *)local_e8,(CBB *)local_1d8), iVar27 == 0))
             || (iVar27 = CBB_add_u16((CBB *)local_1d8,uVar23), iVar27 == 0)) ||
            ((iVar27 = CBB_add_u16_length_prefixed((CBB *)local_1d8,(CBB *)local_b8), iVar27 == 0 ||
             (psVar6 = (this->_M_t).super___uniq_ptr_impl<ssl_session_st,_bssl::internal::Deleter>.
                       _M_t.super__Tuple_impl<0UL,_ssl_session_st_*,_bssl::internal::Deleter>.
                       super__Head_base<0UL,_ssl_session_st_*,_false>._M_head_impl,
             iVar27 = CBB_add_bytes((CBB *)local_b8,(psVar6->local_application_settings).data_,
                                    (psVar6->local_application_settings).size_), iVar27 == 0)))) ||
           (bVar21 = ssl_add_message_cbb(pSVar34,(CBB *)local_188), !bVar21)) {
          CBB_cleanup((CBB *)local_188);
          goto LAB_001648e7;
        }
        CBB_cleanup((CBB *)local_188);
      }
      hs->tls13_state = 0xb;
LAB_00163f24:
      sVar38 = ssl_hs_ok;
      break;
    case 0xb:
      if ((hs->field_0x6c8 & 0x20) == 0) {
        hs->tls13_state = 0xd;
        goto LAB_00163f24;
      }
      pSVar34 = hs->ssl;
      if (pSVar34->s3->ech_status == ssl_ech_rejected) {
        SSL_certs_clear(pSVar34);
      }
      else {
        pCVar7 = (hs->config->cert)._M_t.super___uniq_ptr_impl<bssl::CERT,_bssl::internal::Deleter>.
                 _M_t.super__Tuple_impl<0UL,_bssl::CERT_*,_bssl::internal::Deleter>.
                 super__Head_base<0UL,_bssl::CERT_*,_false>._M_head_impl;
        p_Var8 = pCVar7->cert_cb;
        if (p_Var8 != (_func_int_SSL_ptr_void_ptr *)0x0) {
          iVar27 = (*p_Var8)(pSVar34,pCVar7->cert_cb_arg);
          if (iVar27 == 0) {
            ssl_send_alert(pSVar34,2,0x50);
            iVar27 = 0x7e;
            iVar35 = 0x3a0;
            goto LAB_00164493;
          }
          if (iVar27 < 0) {
            hs->tls13_state = 0xb;
            sVar38 = ssl_hs_x509_lookup;
            break;
          }
        }
      }
      local_188._0_8_ = (uint8_t *)0x0;
      local_188._8_8_ = 0;
      bVar21 = ssl_get_full_credential_list(hs,(Array<ssl_credential_st_*> *)local_188);
      sVar38 = ssl_hs_error;
      if (bVar21) {
        local_70 = pSVar34;
        if ((uint8_t *)local_188._8_8_ != (uint8_t *)0x0) {
          uVar12 = local_188._0_8_;
          lVar36 = local_188._8_8_ << 3;
          lVar32 = 0;
          do {
            cred = *(SSL_CREDENTIAL **)((long)(CBB **)uVar12 + lVar32);
            ERR_clear_error();
            if (cred->type == kX509) {
              bVar21 = tls1_choose_signature_algorithm(hs,cred,(uint16_t *)local_1d8);
              if ((bVar21) && (bVar21 = ssl_credential_matches_requested_issuers(hs,cred), bVar21))
              {
                SSL_CREDENTIAL_up_ref(cred);
                local_e8 = (undefined1  [8])0x0;
                std::__uniq_ptr_impl<ssl_credential_st,_bssl::internal::Deleter>::reset
                          ((__uniq_ptr_impl<ssl_credential_st,_bssl::internal::Deleter> *)local_f0,
                           cred);
                std::unique_ptr<ssl_credential_st,_bssl::internal::Deleter>::~unique_ptr
                          ((unique_ptr<ssl_credential_st,_bssl::internal::Deleter> *)local_e8);
                hs->signature_algorithm = local_1d8._0_2_;
                break;
              }
            }
            else {
              ERR_put_error(0x10,0,0xe4,
                            "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/ssl/tls13_client.cc"
                            ,0x381);
            }
            lVar32 = lVar32 + 8;
          } while (lVar36 != lVar32);
          in_stack_fffffffffffffe10 = this;
          if ((local_f0->_M_t).super___uniq_ptr_impl<ssl_credential_st,_bssl::internal::Deleter>.
              _M_t.super__Tuple_impl<0UL,_ssl_credential_st_*,_bssl::internal::Deleter>.
              super__Head_base<0UL,_ssl_credential_st_*,_false>._M_head_impl ==
              (ssl_credential_st *)0x0) {
            uVar30 = ERR_peek_error();
            if ((int)uVar30 == 0) {
              __assert_fail("ERR_peek_error() != 0",
                            "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/ssl/tls13_client.cc"
                            ,0x3bb,
                            "enum ssl_hs_wait_t bssl::do_send_client_certificate(SSL_HANDSHAKE *)");
            }
            ssl_send_alert(local_70,2,0x28);
            goto LAB_00164426;
          }
        }
        bVar21 = tls13_add_certificate(hs);
        if (bVar21) {
          hs->tls13_state = 0xc;
          sVar38 = ssl_hs_ok;
        }
      }
LAB_00164426:
      OPENSSL_free((void *)local_188._0_8_);
      break;
    case 0xc:
      sVar38 = ssl_hs_ok;
      iVar27 = 0xd;
      if (((local_f0->_M_t).super___uniq_ptr_impl<ssl_credential_st,_bssl::internal::Deleter>._M_t.
           super__Tuple_impl<0UL,_ssl_credential_st_*,_bssl::internal::Deleter>.
           super__Head_base<0UL,_ssl_credential_st_*,_false>._M_head_impl !=
           (ssl_credential_st *)0x0) &&
         (sVar24 = tls13_add_certificate_verify(hs), sVar24 != ssl_private_key_success)) {
        sVar38 = ssl_hs_error;
        if (sVar24 == ssl_private_key_failure) break;
        if (sVar24 != ssl_private_key_retry) {
          __assert_fail("0",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/ssl/tls13_client.cc"
                        ,0x3dd,
                        "enum ssl_hs_wait_t bssl::do_send_client_certificate_verify(SSL_HANDSHAKE *)"
                       );
        }
        sVar38 = ssl_hs_private_key_operation;
        iVar27 = 0xc;
      }
      hs->tls13_state = iVar27;
      break;
    case 0xd:
      pSVar34 = hs->ssl;
      uVar31 = *(uint *)&hs->field_0x6c8;
      *(uint *)&hs->field_0x6c8 = uVar31 | 0x800000;
      if ((uVar31 >> 0x18 & 1) != 0) {
        CBB_zero((CBB *)local_188);
        bVar21 = (*pSVar34->method->init_message)(pSVar34,(CBB *)local_188,(CBB *)local_e8,0xcb);
        if (((!bVar21) || (bVar21 = tls1_write_channel_id(hs,(CBB *)local_e8), !bVar21)) ||
           (bVar21 = ssl_add_message_cbb(pSVar34,(CBB *)local_188), !bVar21)) {
          CBB_cleanup((CBB *)local_188);
          goto LAB_001648e7;
        }
        CBB_cleanup((CBB *)local_188);
      }
      bVar21 = tls13_add_finished(hs);
      sVar38 = ssl_hs_error;
      if (bVar21) {
        in_R9 = (ulong)(hs->client_traffic_secret_0).size_;
        traffic_secret.data_._7_1_ = (bool)in_stack_fffffffffffffe0f;
        traffic_secret.data_._0_7_ = in_stack_fffffffffffffe08;
        traffic_secret.size_ = (size_t)in_stack_fffffffffffffe10;
        bVar21 = tls13_set_traffic_key
                           ((bssl *)pSVar34,(SSL *)0x3,ssl_encryption_early_data,
                            (evp_aead_direction_t)
                            (hs->new_session)._M_t.
                            super___uniq_ptr_impl<ssl_session_st,_bssl::internal::Deleter>._M_t.
                            super__Tuple_impl<0UL,_ssl_session_st_*,_bssl::internal::Deleter>.
                            super__Head_base<0UL,_ssl_session_st_*,_false>._M_head_impl,local_38,
                            traffic_secret);
        sVar38 = ssl_hs_error;
        if (bVar21) {
          in_R9 = (ulong)(hs->server_traffic_secret_0).size_;
          traffic_secret_00.data_._7_1_ = (bool)in_stack_fffffffffffffe0f;
          traffic_secret_00.data_._0_7_ = in_stack_fffffffffffffe08;
          traffic_secret_00.size_ = (size_t)in_stack_fffffffffffffe10;
          bVar21 = tls13_set_traffic_key
                             ((bssl *)pSVar34,(SSL *)0x3,ssl_encryption_initial,
                              (evp_aead_direction_t)
                              (hs->new_session)._M_t.
                              super___uniq_ptr_impl<ssl_session_st,_bssl::internal::Deleter>._M_t.
                              super__Tuple_impl<0UL,_ssl_session_st_*,_bssl::internal::Deleter>.
                              super__Head_base<0UL,_ssl_session_st_*,_false>._M_head_impl,local_40,
                              traffic_secret_00);
          sVar38 = ssl_hs_error;
          if ((bVar21) && (bVar21 = tls13_derive_resumption_secret(hs), bVar21)) {
            hs->tls13_state = 0xe;
            goto LAB_00163b4a;
          }
        }
      }
      break;
    case 0xe:
      return ssl_hs_ok;
    }
    if (hs->tls13_state != (int)local_78) {
      ssl_do_info_callback(hs->ssl,0x1001,1);
    }
    if (sVar38 != ssl_hs_ok) {
      return sVar38;
    }
  } while( true );
}

Assistant:

enum ssl_hs_wait_t tls13_client_handshake(SSL_HANDSHAKE *hs) {
  while (hs->tls13_state != state_done) {
    enum ssl_hs_wait_t ret = ssl_hs_error;
    enum client_hs_state_t state =
        static_cast<enum client_hs_state_t>(hs->tls13_state);
    switch (state) {
      case state_read_hello_retry_request:
        ret = do_read_hello_retry_request(hs);
        break;
      case state_send_second_client_hello:
        ret = do_send_second_client_hello(hs);
        break;
      case state_read_server_hello:
        ret = do_read_server_hello(hs);
        break;
      case state_read_encrypted_extensions:
        ret = do_read_encrypted_extensions(hs);
        break;
      case state_read_certificate_request:
        ret = do_read_certificate_request(hs);
        break;
      case state_read_server_certificate:
        ret = do_read_server_certificate(hs);
        break;
      case state_read_server_certificate_verify:
        ret = do_read_server_certificate_verify(hs);
        break;
      case state_server_certificate_reverify:
        ret = do_server_certificate_reverify(hs);
        break;
      case state_read_server_finished:
        ret = do_read_server_finished(hs);
        break;
      case state_send_end_of_early_data:
        ret = do_send_end_of_early_data(hs);
        break;
      case state_send_client_certificate:
        ret = do_send_client_certificate(hs);
        break;
      case state_send_client_encrypted_extensions:
        ret = do_send_client_encrypted_extensions(hs);
        break;
      case state_send_client_certificate_verify:
        ret = do_send_client_certificate_verify(hs);
        break;
      case state_complete_second_flight:
        ret = do_complete_second_flight(hs);
        break;
      case state_done:
        ret = ssl_hs_ok;
        break;
    }

    if (hs->tls13_state != state) {
      ssl_do_info_callback(hs->ssl, SSL_CB_CONNECT_LOOP, 1);
    }

    if (ret != ssl_hs_ok) {
      return ret;
    }
  }

  return ssl_hs_ok;
}